

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEditor.cc
# Opt level: O3

void __thiscall
GraphEditorNodeExpansion::GraphEditorNodeExpansion
          (GraphEditorNodeExpansion *this,sgNodeID_t node,
          vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *links_through)

{
  vector<long,_std::allocator<long>_> *this_00;
  vector<long,_std::allocator<long>_> *this_01;
  pointer ppVar1;
  long *plVar2;
  iterator iVar3;
  long *__args;
  pointer ppVar4;
  sgNodeID_t local_30;
  
  this_00 = &(this->super_GraphEditorOperation).input_nodes;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).consumed_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GraphEditorOperation).input_ends.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GraphEditorOperation).input_nodes.super__Vector_base<long,_std::allocator<long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30 = node;
  std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
            ((vector<long,std::allocator<long>> *)this_00,(iterator)0x0,&local_30);
  ppVar4 = (links_through->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (links_through->
           super__Vector_base<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar1) {
    this_01 = &(this->super_GraphEditorOperation).input_ends;
    __args = &ppVar4->second;
    do {
      iVar3._M_current =
           (this->super_GraphEditorOperation).input_ends.
           super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
      ;
      plVar2 = (this->super_GraphEditorOperation).input_ends.
               super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage;
      if (iVar3._M_current == plVar2) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)this_01,iVar3,__args + -1);
        iVar3._M_current =
             (this->super_GraphEditorOperation).input_ends.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        plVar2 = (this->super_GraphEditorOperation).input_ends.
                 super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
      }
      else {
        *iVar3._M_current = ((pair<long,_long> *)(__args + -1))->first;
        iVar3._M_current = iVar3._M_current + 1;
        (this->super_GraphEditorOperation).input_ends.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar3._M_current;
      }
      if (iVar3._M_current == plVar2) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)this_01,iVar3,__args);
      }
      else {
        *iVar3._M_current = *__args;
        (this->super_GraphEditorOperation).input_ends.
        super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
             iVar3._M_current + 1;
      }
      ppVar4 = (pointer)(__args + 1);
      __args = __args + 2;
    } while (ppVar4 != ppVar1);
  }
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->super_GraphEditorOperation).consumed_nodes,this_00);
  std::vector<long,_std::allocator<long>_>::operator=
            (&(this->super_GraphEditorOperation).consumed_ends,
             &(this->super_GraphEditorOperation).input_ends);
  return;
}

Assistant:

GraphEditorNodeExpansion::GraphEditorNodeExpansion(sgNodeID_t node,
                                                   std::vector<std::pair<sgNodeID_t, sgNodeID_t>> links_through) {

    input_nodes.emplace_back(node);
    for (auto &l:links_through) {
        input_ends.emplace_back(l.first);
        input_ends.emplace_back(l.second);
    }
    consumed_nodes=input_nodes;
    consumed_ends=input_ends;
}